

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
argsman_tests::ArgsMergeTestingSetup::GetValues
          (ArgsMergeTestingSetup *this,ActionList *actions,string *section,string *name,
          string *value_prefix)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  int i;
  Action action;
  Action *__end2;
  Action *__begin2;
  ActionList *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *values;
  int suffix;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  int local_1b8;
  undefined4 in_stack_fffffffffffffe58;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffe28);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)&in_RDX->_M_string_length + 4);
  for (local_198 = in_RDX;
      (local_198 != __lhs && (iVar2 = *(int *)&(local_198->_M_dataplus)._M_p, iVar2 != 0));
      local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&(local_198->_M_dataplus)._M_p + 4)) {
    std::__cxx11::string::string(this_00);
    if ((iVar2 == 3) || (iVar2 == 4)) {
      std::operator+(__lhs,(char *)CONCAT44(iVar2,in_stack_fffffffffffffe58));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_R8,in_R9);
      std::__cxx11::string::~string(in_stack_fffffffffffffe28);
    }
    if ((iVar2 == 1) || (iVar2 == 3)) {
      for (local_1b8 = 0; local_1b8 < 2; local_1b8 = local_1b8 + 1) {
        std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(iVar2,in_stack_fffffffffffffe58));
        std::operator+(this_00,(char *)in_RDI);
        std::operator+(this_00,in_RDI);
        util::ToString<int>((int *)__lhs);
        std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(iVar2,in_stack_fffffffffffffe58));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffe28,(value_type *)0x3c280c);
        std::__cxx11::string::~string(in_stack_fffffffffffffe28);
        std::__cxx11::string::~string(in_stack_fffffffffffffe28);
        std::__cxx11::string::~string(in_stack_fffffffffffffe28);
        std::__cxx11::string::~string(in_stack_fffffffffffffe28);
        std::__cxx11::string::~string(in_stack_fffffffffffffe28);
      }
    }
    if ((iVar2 == 2) || (iVar2 == 4)) {
      std::operator+(__lhs,(char *)CONCAT44(iVar2,in_stack_fffffffffffffe58));
      std::operator+(this_00,in_RDI);
      std::operator+(this_00,(char *)in_RDI);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffe28,(value_type *)0x3c2988);
      std::__cxx11::string::~string(in_stack_fffffffffffffe28);
      std::__cxx11::string::~string(in_stack_fffffffffffffe28);
      std::__cxx11::string::~string(in_stack_fffffffffffffe28);
    }
    std::__cxx11::string::~string(in_stack_fffffffffffffe28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<std::string> GetValues(const ActionList& actions,
        const std::string& section,
        const std::string& name,
        const std::string& value_prefix)
    {
        std::vector<std::string> values;
        int suffix = 0;
        for (Action action : actions) {
            if (action == NONE) break;
            std::string prefix;
            if (action == SECTION_SET || action == SECTION_NEGATE) prefix = section + ".";
            if (action == SET || action == SECTION_SET) {
                for (int i = 0; i < 2; ++i) {
                    values.push_back(prefix + name + "=" + value_prefix + ToString(++suffix));
                }
            }
            if (action == NEGATE || action == SECTION_NEGATE) {
                values.push_back(prefix + "no" + name + "=1");
            }
        }
        return values;
    }